

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_SB(DisasContext_conflict1 *s,arg_SB *a)

{
  uint uVar1;
  
  uVar1 = s->isar->id_isar6;
  if ((uVar1 & 0xf000) != 0) {
    tcg_gen_mb_aarch64(s->uc->tcg_ctx,TCG_BAR_SC|TCG_MO_ALL);
    gen_goto_tb(s,0,(s->base).pc_next);
  }
  return (uVar1 & 0xf000) != 0;
}

Assistant:

static bool trans_SB(DisasContext *s, arg_SB *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!dc_isar_feature(aa32_sb, s)) {
        return false;
    }
    /*
     * TODO: There is no speculation barrier opcode
     * for TCG; MB and end the TB instead.
     */
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_SC);
    gen_goto_tb(s, 0, s->base.pc_next);
    return true;
}